

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7_arr_func_3.cpp
# Opt level: O3

void show_array(double *ar,int n)

{
  ulong uVar1;
  ostream *poVar2;
  ulong uVar3;
  
  if (0 < n) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Property #",10);
      uVar1 = uVar3 + 1;
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," : $",4);
      poVar2 = std::ostream::_M_insert<double>(ar[uVar3]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar3 = uVar1;
    } while ((uint)n != uVar1);
  }
  return;
}

Assistant:

void show_array (const double ar[], int n)
{
    using namespace std;
    for (int i = 0; i < n; i++)
    {
        cout << "Property #" << (i + 1) << " : $";
        cout << ar[i] << endl;
    }
}